

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unsupp.cpp
# Opt level: O0

bool ReadUnsupported(MemFile *file,shared_ptr<Disk> *param_2)

{
  bool bVar1;
  ulong extraout_RAX;
  pointer pvVar2;
  ulong uVar3;
  exception *this;
  bool local_302;
  allocator local_2e9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2e8;
  allocator local_2c1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2c0;
  byte local_29b;
  byte local_29a;
  allocator local_299;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_298;
  allocator local_261;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_260;
  undefined1 local_240 [8];
  string strType;
  array<char,_512UL> buf;
  shared_ptr<Disk> *param_1_local;
  MemFile *file_local;
  
  MemFile::rewind(file,(FILE *)param_2);
  if (((extraout_RAX & 1) != 0) &&
     (bVar1 = MemFile::read<std::array<char,512ul>>
                        (file,(array<char,_512UL> *)((long)&strType.field_2 + 8)), bVar1)) {
    std::__cxx11::string::string((string *)local_240);
    pvVar2 = std::array<char,_512UL>::data((array<char,_512UL> *)((long)&strType.field_2 + 8));
    std::allocator<char>::allocator();
    local_29a = 0;
    local_29b = 0;
    std::__cxx11::string::string((string *)&local_260,pvVar2,0xc,&local_261);
    bVar1 = std::operator==(&local_260,"CPC-Emulator");
    local_302 = false;
    if (bVar1) {
      pvVar2 = std::array<char,_512UL>::data((array<char,_512UL> *)((long)&strType.field_2 + 8));
      std::allocator<char>::allocator();
      local_29a = 1;
      std::__cxx11::string::string((string *)&local_298,pvVar2 + 0x10,10,&local_299);
      local_29b = 1;
      local_302 = std::operator==(&local_298,"DiskImageV");
    }
    if ((local_29b & 1) != 0) {
      std::__cxx11::string::~string((string *)&local_298);
    }
    if ((local_29a & 1) != 0) {
      std::allocator<char>::~allocator((allocator<char> *)&local_299);
    }
    std::__cxx11::string::~string((string *)&local_260);
    std::allocator<char>::~allocator((allocator<char> *)&local_261);
    if (local_302 == false) {
      pvVar2 = std::array<char,_512UL>::data((array<char,_512UL> *)((long)&strType.field_2 + 8));
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_2c0,pvVar2,4,&local_2c1);
      bVar1 = std::operator==(&local_2c0,"CPCD");
      std::__cxx11::string::~string((string *)&local_2c0);
      std::allocator<char>::~allocator((allocator<char> *)&local_2c1);
      if (bVar1) {
        std::__cxx11::string::operator=((string *)local_240,"EmuCPC");
      }
      else {
        pvVar2 = std::array<char,_512UL>::data((array<char,_512UL> *)((long)&strType.field_2 + 8));
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_2e8,pvVar2,8,&local_2e9);
        bVar1 = std::operator==(&local_2e8,"NORMDISK");
        std::__cxx11::string::~string((string *)&local_2e8);
        std::allocator<char>::~allocator((allocator<char> *)&local_2e9);
        if (bVar1) {
          std::__cxx11::string::operator=((string *)local_240,"CPD");
        }
      }
    }
    else {
      std::__cxx11::string::operator=((string *)local_240,"CPCemu");
    }
    uVar3 = std::__cxx11::string::empty();
    if ((uVar3 & 1) == 0) {
      this = (exception *)__cxa_allocate_exception(0x10);
      util::exception::exception<std::__cxx11::string&,char_const(&)[41]>
                (this,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_240
                 ,(char (*) [41])" disk images are not currently supported");
      __cxa_throw(this,&util::exception::typeinfo,util::exception::~exception);
    }
    std::__cxx11::string::~string((string *)local_240);
  }
  return false;
}

Assistant:

bool ReadUnsupported(MemFile& file, std::shared_ptr<Disk>&/*disk*/)
{
    std::array<char, SECTOR_SIZE> buf;
    if (!file.rewind() || !file.read(buf))
        return false;

    std::string strType;

    if (std::string(buf.data() + 0x00, 12) == "CPC-Emulator" && std::string(buf.data() + 0x10, 10) == "DiskImageV")
        strType = "CPCemu";
    else if (std::string(buf.data() + 0x00, 4) == "CPCD")
        strType = "EmuCPC";
    else if (std::string(buf.data() + 0x00, 8) == "NORMDISK")
        strType = "CPD";

    if (!strType.empty())
        throw util::exception(strType, " disk images are not currently supported");

    return false;
}